

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O1

aiMaterial * __thiscall
Assimp::Ogre::OgreImporter::ReadMaterial
          (OgreImporter *this,string *pFile,IOSystem *pIOHandler,string *materialName)

{
  pointer pcVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  Logger *pLVar7;
  size_type __n;
  undefined8 uVar8;
  size_t sVar9;
  aiMaterial *this_00;
  undefined1 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  aiString *paVar15;
  undefined8 *puVar16;
  string linePart;
  float Shininess;
  string skipped;
  string partTechnique;
  string partMaterial;
  string techniqueName;
  aiString ts;
  stringstream ss;
  undefined1 local_a98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a78;
  long local_a60 [2];
  OgreImporter *local_a50;
  undefined1 *local_a48;
  undefined8 local_a40;
  undefined1 local_a38;
  undefined7 uStack_a37;
  undefined1 *local_a28;
  undefined8 local_a20;
  undefined1 local_a18;
  undefined7 uStack_a17;
  long *local_a08;
  pointer local_a00;
  long local_9f8 [2];
  long *local_9e8;
  pointer local_9e0;
  long local_9d8 [2];
  aiString local_9c8;
  undefined1 local_5c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0 [6];
  ios_base local_550 [920];
  long local_1b8 [2];
  long local_1a8 [2];
  byte abStack_198 [96];
  ios_base local_138 [264];
  
  if (materialName->_M_string_length == 0) {
    return (aiMaterial *)0x0;
  }
  local_a50 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_a98._0_8_ = (pointer)0x0;
  local_a98._8_8_ = (pointer)0x0;
  local_a98._16_8_ = (pointer)0x0;
  pcVar1 = (materialName->_M_dataplus)._M_p;
  local_5c0._0_8_ = local_5b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,pcVar1,pcVar1 + materialName->_M_string_length);
  std::__cxx11::string::append(local_5c0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._0_8_ != local_5b0) {
    operator_delete((void *)local_5c0._0_8_,local_5b0[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::rfind((char *)pFile,0x76b14c,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_9c8,(ulong)pFile);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_9c8);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar11) {
    local_5b0[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_5b0[0]._8_8_ = plVar6[3];
    local_5c0._0_8_ = local_5b0;
  }
  else {
    local_5b0[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_5c0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar6;
  }
  local_5c0._8_8_ = plVar6[1];
  *plVar6 = (long)paVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._0_8_ != local_5b0) {
    operator_delete((void *)local_5c0._0_8_,local_5b0[0]._M_allocated_capacity + 1);
  }
  if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
    operator_delete((void *)local_9c8._0_8_,CONCAT71(local_9c8.data._13_7_,local_9c8.data[0xc]) + 1)
    ;
  }
  local_a78._M_allocated_capacity = (size_type)materialName;
  if ((local_a50->m_userDefinedMaterialLibFile)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a98,&local_a50->m_userDefinedMaterialLibFile);
  }
  if (local_a98._8_8_ != local_a98._0_8_) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      uVar2 = local_a98._0_8_;
      local_5c0._0_8_ = local_5b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"rb","");
      iVar5 = (*pIOHandler->_vptr_IOSystem[4])
                        (pIOHandler,*(undefined8 *)((long)&((_Alloc_hider *)uVar2)->_M_p + lVar13),
                         local_5c0._0_8_);
      plVar6 = (long *)CONCAT44(extraout_var,iVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ != local_5b0) {
        operator_delete((void *)local_5c0._0_8_,local_5b0[0]._M_allocated_capacity + 1);
      }
      if (plVar6 != (long *)0x0) goto LAB_00484bd4;
      pLVar7 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[27]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                 (char (*) [27])"Source file for material \'");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c0,*(char **)local_a78._M_allocated_capacity,
                 *(size_type *)(local_a78._M_allocated_capacity + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c0,"\' ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c0,
                 *(char **)((long)&((_Alloc_hider *)local_a98._0_8_)->_M_p + lVar13),
                 *(long *)((long)(local_a98._0_8_ + 8) + lVar13));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c0," does not exist",0xf)
      ;
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar7,(char *)local_9c8._0_8_);
      if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
        operator_delete((void *)local_9c8._0_8_,
                        CONCAT71(local_9c8.data._13_7_,local_9c8.data[0xc]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
      std::ios_base::~ios_base(local_550);
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x20;
    } while (uVar14 < (ulong)((long)(local_a98._8_8_ - local_a98._0_8_) >> 5));
  }
  plVar6 = (long *)0x0;
LAB_00484bd4:
  if (plVar6 == (long *)0x0) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[42]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
               (char (*) [42])"Failed to find source file for material \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5c0,*(char **)local_a78._M_allocated_capacity,
               *(size_type *)(local_a78._M_allocated_capacity + 8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c0,"\'",1);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar7,(char *)local_9c8._0_8_);
    if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
      operator_delete((void *)local_9c8._0_8_,
                      CONCAT71(local_9c8.data._13_7_,local_9c8.data[0xc]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
    std::ios_base::~ios_base(local_550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a98);
  }
  else {
    lVar13 = (**(code **)(*plVar6 + 0x30))(plVar6);
    if (lVar13 == 0) {
      pLVar7 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[27]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                 (char (*) [27])"Source file for material \'");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c0,*(char **)local_a78._M_allocated_capacity,
                 *(size_type *)(local_a78._M_allocated_capacity + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c0,"\' is empty (size is 0 bytes)",0x1c);
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar7,(char *)local_9c8._0_8_);
      if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
        operator_delete((void *)local_9c8._0_8_,
                        CONCAT71(local_9c8.data._13_7_,local_9c8.data[0xc]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
      std::ios_base::~ios_base(local_550);
    }
    else {
      __n = (**(code **)(*plVar6 + 0x30))(plVar6);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_5c0,__n,(allocator_type *)&local_9c8);
      uVar2 = local_5c0._0_8_;
      uVar8 = (**(code **)(*plVar6 + 0x30))(plVar6);
      (**(code **)(*plVar6 + 0x10))(plVar6,uVar2,uVar8,1);
      BaseImporter::ConvertToUTF8((vector<char,_std::allocator<char>_> *)local_5c0);
      local_9c8._0_8_ = local_9c8._0_8_ & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                ((vector<char,_std::allocator<char>_> *)local_5c0,(char *)&local_9c8);
      uVar2 = local_5c0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar9 = strlen((char *)local_5c0._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)uVar2,sVar9)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_5c0._0_8_,local_5b0[0]._M_allocated_capacity - local_5c0._0_8_
                       );
      }
    }
    (**(code **)(*plVar6 + 8))(plVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a98);
    if (lVar13 != 0) {
      pLVar7 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[19]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                 (char (*) [19])"Reading material \'");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c0,*(char **)local_a78._M_allocated_capacity,
                 *(size_type *)(local_a78._M_allocated_capacity + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c0,"\'",1);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar7,(char *)local_9c8._0_8_);
      if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
        operator_delete((void *)local_9c8._0_8_,
                        CONCAT71(local_9c8.data._13_7_,local_9c8.data[0xc]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
      std::ios_base::~ios_base(local_550);
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      std::
      _Rb_tree<aiTextureType,_std::pair<const_aiTextureType,_unsigned_int>,_std::_Select1st<std::pair<const_aiTextureType,_unsigned_int>_>,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
      ::clear(&(local_a50->m_textures)._M_t);
      sVar9 = 0x3ff;
      if ((*(size_type *)(local_a78._M_allocated_capacity + 8) & 0xfffffc00) == 0) {
        sVar9 = *(size_type *)(local_a78._M_allocated_capacity + 8) & 0xffffffff;
      }
      local_5c0._0_4_ = (int)sVar9;
      memcpy(local_5c0 + 4,*(void **)local_a78._M_allocated_capacity,sVar9);
      local_5c0[sVar9 + 4] = 0;
      pcVar12 = (char *)0x0;
      aiMaterial::AddProperty(this_00,(aiString *)local_5c0,"?mat.name",0,0);
      local_a98._0_8_ = local_a98 + 0x10;
      local_a98._8_8_ = (pointer)0x0;
      local_a98._16_8_ = local_a98._16_8_ & 0xffffffffffffff00;
      std::operator>>((istream *)local_1b8,(string *)local_a98);
      local_9e8 = local_9d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"material","");
      local_a08 = local_9f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"technique","");
      if ((abStack_198[*(long *)(local_1b8[0] + -0x18)] & 2) == 0) {
        do {
          uVar2 = local_a98._8_8_;
          puVar16 = (undefined8 *)(local_1b8[0] + -0x18);
          cVar3 = (char)(istream *)local_1b8;
          if (((pointer)local_a98._8_8_ == DAT_009c40c8) &&
             (((pointer)local_a98._8_8_ == (pointer)0x0 ||
              (iVar5 = bcmp((void *)local_a98._0_8_,partComment_abi_cxx11_,local_a98._8_8_),
              iVar5 == 0)))) {
            local_a28 = &local_a18;
            local_a20 = 0;
            local_a18 = 0;
            cVar3 = std::ios::widen((char)*puVar16 + cVar3);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_1b8,(string *)&local_a28,cVar3);
            std::operator>>((istream *)local_1b8,(string *)local_a98);
            if (local_a28 != &local_a18) {
              operator_delete(local_a28,CONCAT71(uStack_a17,local_a18) + 1);
            }
          }
          else {
            if (((pointer)uVar2 == local_9e0) &&
               (((((pointer)uVar2 == (pointer)0x0 ||
                  (iVar5 = bcmp((void *)local_a98._0_8_,local_9e8,uVar2), iVar5 == 0)) &&
                 (std::operator>>((istream *)local_1b8,(string *)local_a98),
                 (pointer)local_a98._8_8_ == *(pointer *)(local_a78._M_allocated_capacity + 8))) &&
                (((pointer)local_a98._8_8_ == (pointer)0x0 ||
                 (iVar5 = bcmp((void *)local_a98._0_8_,*(void **)local_a78._M_allocated_capacity,
                               local_a98._8_8_), iVar5 == 0)))))) {
              local_a48 = &local_a38;
              local_a40 = 0;
              local_a38 = 0;
              cVar4 = std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) + cVar3);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_1b8,(string *)&local_a48,cVar4);
              std::operator>>((istream *)local_1b8,(string *)local_a98);
              if (local_a48 != &local_a38) {
                operator_delete(local_a48,CONCAT71(uStack_a37,local_a38) + 1);
              }
              if (((pointer)local_a98._8_8_ != DAT_009c40e8) ||
                 (((pointer)local_a98._8_8_ != (pointer)0x0 &&
                  (iVar5 = bcmp((void *)local_a98._0_8_,partBlockStart_abi_cxx11_,local_a98._8_8_),
                  iVar5 != 0)))) {
                pLVar7 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[50]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_9c8,
                           (char (*) [50])"Invalid material: block start missing near index ");
                std::istream::tellg();
                std::ostream::_M_insert<long>((long)&local_9c8);
                std::__cxx11::stringbuf::str();
                Logger::error(pLVar7,(char *)CONCAT44(local_a78._12_4_,local_a78._8_4_));
                if ((long *)CONCAT44(local_a78._12_4_,local_a78._8_4_) != local_a60) {
                  operator_delete((long *)CONCAT44(local_a78._12_4_,local_a78._8_4_),
                                  local_a60[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_9c8);
                std::ios_base::~ios_base((ios_base *)(local_9c8.data + 0x6c));
                break;
              }
              pLVar7 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[11]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_9c8,(char (*) [11])0x76c783);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_9c8,*(char **)local_a78._M_allocated_capacity,
                         *(size_type *)(local_a78._M_allocated_capacity + 8));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_9c8,"\'",1);
              std::__cxx11::stringbuf::str();
              Logger::debug(pLVar7,(char *)CONCAT44(local_a78._12_4_,local_a78._8_4_));
              if ((long *)CONCAT44(local_a78._12_4_,local_a78._8_4_) != local_a60) {
                operator_delete((long *)CONCAT44(local_a78._12_4_,local_a78._8_4_),local_a60[0] + 1)
                ;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_9c8);
              std::ios_base::~ios_base((ios_base *)(local_9c8.data + 0x6c));
              while (((pointer)local_a98._8_8_ != DAT_009c4108 ||
                     (((pointer)local_a98._8_8_ != (pointer)0x0 &&
                      (iVar5 = bcmp((void *)local_a98._0_8_,partBlockEnd_abi_cxx11_,local_a98._8_8_)
                      , iVar5 != 0))))) {
                std::operator>>((istream *)local_1b8,(string *)local_a98);
                if (((pointer)local_a98._8_8_ == local_a00) &&
                   (((pointer)local_a98._8_8_ == (pointer)0x0 ||
                    (iVar5 = bcmp((void *)local_a98._0_8_,local_a08,local_a98._8_8_), iVar5 == 0))))
                {
                  local_9c8._0_8_ = local_9c8.data + 0xc;
                  local_9c8.data[4] = '\0';
                  local_9c8.data[5] = '\0';
                  local_9c8.data[6] = '\0';
                  local_9c8.data[7] = '\0';
                  local_9c8.data[8] = '\0';
                  local_9c8.data[9] = '\0';
                  local_9c8.data[10] = '\0';
                  local_9c8.data[0xb] = '\0';
                  local_9c8.data[0xc] = '\0';
                  cVar4 = std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) + cVar3);
                  paVar15 = &local_9c8;
                  std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_1b8,(string *)&local_9c8,cVar4);
                  Trim((string *)&local_9c8,SUB81(paVar15,0));
                  pcVar12 = (char *)this_00;
                  ReadTechnique(local_a50,(string *)&local_9c8,(stringstream *)local_1b8,this_00);
                  if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
                    operator_delete((void *)local_9c8._0_8_,
                                    CONCAT71(local_9c8.data._13_7_,local_9c8.data[0xc]) + 1);
                  }
                }
                iVar5 = std::__cxx11::string::compare((char *)local_a98);
                if (iVar5 == 0) {
                  std::operator>>((istream *)local_1b8,(string *)local_a98);
                  iVar5 = std::__cxx11::string::compare((char *)local_a98);
                  if (((iVar5 != 0) &&
                      (iVar5 = std::__cxx11::string::compare((char *)local_a98), iVar5 != 0)) &&
                     (iVar5 = std::__cxx11::string::compare((char *)local_a98), iVar5 != 0)) {
                    iVar5 = std::__cxx11::string::compare((char *)local_a98);
                    if (iVar5 == 0) {
                      std::operator>>((istream *)local_1b8,(string *)local_a98);
                      sVar9 = local_a98._8_8_ & 0xffffffff;
                      if ((local_a98._8_8_ & 0xfffffc00) != 0) {
                        sVar9 = 0x3ff;
                      }
                      local_9c8.length = (int)sVar9;
                      memcpy((void *)((long)&local_9c8 + 4),(void *)local_a98._0_8_,sVar9);
                      *(undefined1 *)((long)&local_9c8 + sVar9 + 4) = 0;
                      pcVar12 = (char *)0x1;
                      aiMaterial::AddProperty(this_00,&local_9c8,"$tex.file",1,0);
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)local_a98);
                      if (iVar5 == 0) {
                        std::operator>>((istream *)local_1b8,(string *)local_a98);
                        sVar9 = local_a98._8_8_ & 0xffffffff;
                        if ((local_a98._8_8_ & 0xfffffc00) != 0) {
                          sVar9 = 0x3ff;
                        }
                        local_9c8.length = (int)sVar9;
                        memcpy((void *)((long)&local_9c8 + 4),(void *)local_a98._0_8_,sVar9);
                        *(undefined1 *)((long)&local_9c8 + sVar9 + 4) = 0;
                        pcVar12 = &DAT_00000006;
                        aiMaterial::AddProperty(this_00,&local_9c8,"$tex.file",6,0);
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)local_a98);
                        uVar10 = SUB81(pcVar12,0);
                        if (iVar5 == 0) {
                          std::operator>>((istream *)local_1b8,(string *)local_a98);
                          local_9c8._0_8_ = local_9c8._0_8_ & 0xffffffff00000000;
                          fast_atoreal_move<float>
                                    ((Assimp *)local_a98._0_8_,(char *)&local_9c8,(float *)0x1,
                                     (bool)uVar10);
                          local_a78._8_4_ = local_9c8.length;
                          pcVar12 = "$mat.shinpercent";
                          aiMaterial::AddBinaryProperty
                                    (this_00,local_a78._M_local_buf + 8,4,"$mat.shinpercent",0,0,
                                     aiPTI_Float);
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)local_a98);
                          uVar10 = SUB81(pcVar12,0);
                          if (iVar5 == 0) {
                            std::operator>>((istream *)local_1b8,(string *)local_a98);
                            local_9c8._0_8_ = local_9c8._0_8_ & 0xffffffff00000000;
                            fast_atoreal_move<float>
                                      ((Assimp *)local_a98._0_8_,(char *)&local_9c8,(float *)0x1,
                                       (bool)uVar10);
                            local_a78._8_4_ = local_9c8.length;
                            pcVar12 = "$mat.shininess";
                            aiMaterial::AddBinaryProperty
                                      (this_00,local_a78._M_local_buf + 8,4,"$mat.shininess",0,0,
                                       aiPTI_Float);
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)local_a98);
                            if (iVar5 == 0) {
                              std::operator>>((istream *)local_1b8,(string *)local_a98);
                              if (*(char *)&((_Alloc_hider *)local_a98._0_8_)->_M_p == '\"') {
                                std::__cxx11::string::substr((ulong)&local_9c8,(ulong)local_a98);
                                std::__cxx11::string::operator=
                                          ((string *)local_a98,(string *)&local_9c8);
                                if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
                                  operator_delete((void *)local_9c8._0_8_,
                                                  CONCAT71(local_9c8.data._13_7_,local_9c8.data[0xc]
                                                          ) + 1);
                                }
                              }
                              sVar9 = local_a98._8_8_ & 0xffffffff;
                              if ((local_a98._8_8_ & 0xfffffc00) != 0) {
                                sVar9 = 0x3ff;
                              }
                              local_9c8.length = (int)sVar9;
                              memcpy((void *)((long)&local_9c8 + 4),(void *)local_a98._0_8_,sVar9);
                              *(undefined1 *)((long)&local_9c8 + sVar9 + 4) = 0;
                              pcVar12 = (char *)0x1;
                              aiMaterial::AddProperty(this_00,&local_9c8,"$tex.file",1,0);
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)local_a98);
                              if (iVar5 == 0) {
                                std::operator>>((istream *)local_1b8,(string *)local_a98);
                                if (*(char *)&((_Alloc_hider *)local_a98._0_8_)->_M_p == '\"') {
                                  std::__cxx11::string::substr((ulong)&local_9c8,(ulong)local_a98);
                                  std::__cxx11::string::operator=
                                            ((string *)local_a98,(string *)&local_9c8);
                                  if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
                                    operator_delete((void *)local_9c8._0_8_,
                                                    CONCAT71(local_9c8.data._13_7_,
                                                             local_9c8.data[0xc]) + 1);
                                  }
                                }
                                sVar9 = local_a98._8_8_ & 0xffffffff;
                                if ((local_a98._8_8_ & 0xfffffc00) != 0) {
                                  sVar9 = 0x3ff;
                                }
                                local_9c8.length = (int)sVar9;
                                memcpy((void *)((long)&local_9c8 + 4),(void *)local_a98._0_8_,sVar9)
                                ;
                                *(undefined1 *)((long)&local_9c8 + sVar9 + 4) = 0;
                                pcVar12 = (char *)0x7;
                                aiMaterial::AddProperty(this_00,&local_9c8,"$tex.file",7,0);
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)local_a98);
                                if (iVar5 == 0) {
                                  std::operator>>((istream *)local_1b8,(string *)local_a98);
                                  if (*(char *)&((_Alloc_hider *)local_a98._0_8_)->_M_p == '\"') {
                                    std::__cxx11::string::substr((ulong)&local_9c8,(ulong)local_a98)
                                    ;
                                    std::__cxx11::string::operator=
                                              ((string *)local_a98,(string *)&local_9c8);
                                    if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
                                      operator_delete((void *)local_9c8._0_8_,
                                                      CONCAT71(local_9c8.data._13_7_,
                                                               local_9c8.data[0xc]) + 1);
                                    }
                                  }
                                  sVar9 = local_a98._8_8_ & 0xffffffff;
                                  if ((local_a98._8_8_ & 0xfffffc00) != 0) {
                                    sVar9 = 0x3ff;
                                  }
                                  local_9c8.length = (int)sVar9;
                                  memcpy((void *)((long)&local_9c8 + 4),(void *)local_a98._0_8_,
                                         sVar9);
                                  *(undefined1 *)((long)&local_9c8 + sVar9 + 4) = 0;
                                  pcVar12 = &DAT_00000006;
                                  aiMaterial::AddProperty(this_00,&local_9c8,"$tex.file",6,0);
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)local_a98);
                                  if (iVar5 == 0) {
                                    std::operator>>((istream *)local_1b8,(string *)local_a98);
                                    if (*(char *)&((_Alloc_hider *)local_a98._0_8_)->_M_p == '\"') {
                                      std::__cxx11::string::substr
                                                ((ulong)&local_9c8,(ulong)local_a98);
                                      std::__cxx11::string::operator=
                                                ((string *)local_a98,(string *)&local_9c8);
                                      if ((char *)local_9c8._0_8_ != local_9c8.data + 0xc) {
                                        operator_delete((void *)local_9c8._0_8_,
                                                        CONCAT71(local_9c8.data._13_7_,
                                                                 local_9c8.data[0xc]) + 1);
                                      }
                                    }
                                    sVar9 = local_a98._8_8_ & 0xffffffff;
                                    if ((local_a98._8_8_ & 0xfffffc00) != 0) {
                                      sVar9 = 0x3ff;
                                    }
                                    local_9c8.length = (int)sVar9;
                                    memcpy((void *)((long)&local_9c8 + 4),(void *)local_a98._0_8_,
                                           sVar9);
                                    *(undefined1 *)((long)&local_9c8 + sVar9 + 4) = 0;
                                    pcVar12 = &DAT_0000000a;
                                    aiMaterial::AddProperty(this_00,&local_9c8,"$tex.file",10,0);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            std::operator>>((istream *)local_1b8,(string *)local_a98);
          }
        } while ((abStack_198[*(long *)(local_1b8[0] + -0x18)] & 2) == 0);
      }
      if (local_a08 != local_9f8) {
        operator_delete(local_a08,local_9f8[0] + 1);
      }
      if (local_9e8 != local_9d8) {
        operator_delete(local_9e8,local_9d8[0] + 1);
      }
      if ((pointer)local_a98._0_8_ != (pointer)(local_a98 + 0x10)) {
        operator_delete((void *)local_a98._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_a98._16_8_)->_M_p + 1));
      }
      goto LAB_00485a1a;
    }
  }
  this_00 = (aiMaterial *)0x0;
LAB_00485a1a:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return this_00;
}

Assistant:

aiMaterial* OgreImporter::ReadMaterial(const std::string &pFile, Assimp::IOSystem *pIOHandler, const std::string &materialName)
{
    if (materialName.empty()) {
        return 0;
    }

    // Full reference and examples of Ogre Material Script
    // can be found from http://www.ogre3d.org/docs/manual/manual_14.html

    /*and here is another one:

    import * from abstract_base_passes_depth.material
    import * from abstract_base.material
    import * from mat_shadow_caster.material
    import * from mat_character_singlepass.material

    material hero/hair/caster : mat_shadow_caster_skin_areject
    {
      set $diffuse_map "hero_hair_alpha_c.dds"
    }

    material hero/hair_alpha : mat_char_cns_singlepass_areject_4weights
    {
      set $diffuse_map  "hero_hair_alpha_c.dds"
      set $specular_map "hero_hair_alpha_s.dds"
      set $normal_map   "hero_hair_alpha_n.dds"
      set $light_map    "black_lightmap.dds"

      set $shadow_caster_material "hero/hair/caster"
    }
    */

    stringstream ss;

    // Scope for scopre_ptr auto release
    {
        /* There are three .material options in priority order:
            1) File with the material name (materialName)
            2) File with the mesh files base name (pFile)
            3) Optional user defined material library file (m_userDefinedMaterialLibFile) */
        std::vector<string> potentialFiles;
        potentialFiles.push_back(materialName + ".material");
        potentialFiles.push_back(pFile.substr(0, pFile.rfind(".mesh")) + ".material");
        if (!m_userDefinedMaterialLibFile.empty())
            potentialFiles.push_back(m_userDefinedMaterialLibFile);

        IOStream *materialFile = 0;
        for(size_t i=0; i<potentialFiles.size(); ++i)
        {
            materialFile = pIOHandler->Open(potentialFiles[i]);
            if (materialFile) {
                break;
            }
            ASSIMP_LOG_DEBUG_F( "Source file for material '", materialName, "' ", potentialFiles[i], " does not exist");
        }
        if (!materialFile)
        {
            ASSIMP_LOG_ERROR_F( "Failed to find source file for material '", materialName, "'");
            return 0;
        }

        std::unique_ptr<IOStream> stream(materialFile);
        if (stream->FileSize() == 0)
        {
            ASSIMP_LOG_WARN_F( "Source file for material '", materialName, "' is empty (size is 0 bytes)");
            return 0;
        }

        // Read bytes
        vector<char> data(stream->FileSize());
        stream->Read(&data[0], stream->FileSize(), 1);

        // Convert to UTF-8 and terminate the string for ss
        BaseImporter::ConvertToUTF8(data);
        data.push_back('\0');

        ss << &data[0];
    }

    ASSIMP_LOG_DEBUG_F("Reading material '", materialName, "'");

    aiMaterial *material = new aiMaterial();
    m_textures.clear();

    aiString ts(materialName);
    material->AddProperty(&ts, AI_MATKEY_NAME);

    // The stringstream will push words from a line until newline.
    // It will also trim whitespace from line start and between words.
    string linePart;
    ss >> linePart;

    const string partMaterial   = "material";
    const string partTechnique  = "technique";

    while(!ss.eof())
    {
        // Skip commented lines
        if (linePart == partComment)
        {
            NextAfterNewLine(ss, linePart);
            continue;
        }
        if (linePart != partMaterial)
        {
            ss >> linePart;
            continue;
        }

        ss >> linePart;
        if (linePart != materialName)
        {
            ss >> linePart;
            continue;
        }

        NextAfterNewLine(ss, linePart);
        if (linePart != partBlockStart)
        {
            ASSIMP_LOG_ERROR_F( "Invalid material: block start missing near index ", ss.tellg());
            return material;
        }

        ASSIMP_LOG_DEBUG_F("material '", materialName, "'");

        while(linePart != partBlockEnd)
        {
            // Proceed to the first technique
            ss >> linePart;

            if (linePart == partTechnique)
            {
                string techniqueName = SkipLine(ss);
                ReadTechnique(Trim(techniqueName), ss, material);
            }

            // Read information from a custom material
            /** @todo This "set $x y" does not seem to be a official Ogre material system feature.
                Materials can inherit other materials and override texture units by using the (unique)
                parent texture unit name in your cloned material.
                This is not yet supported and below code is probably some hack from the original
                author of this Ogre importer. Should be removed? */
            if (linePart=="set")
            {
                ss >> linePart;
                if (linePart=="$specular")//todo load this values:
                {
                }
                else if (linePart=="$diffuse")
                {
                }
                else if (linePart=="$ambient")
                {
                }
                else if (linePart=="$colormap")
                {
                    ss >> linePart;
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_DIFFUSE, 0));
                }
                else if (linePart=="$normalmap")
                {
                    ss >> linePart;
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_NORMALS, 0));
                }
                else if (linePart=="$shininess_strength")
                {
                    ss >> linePart;
                    float Shininess = fast_atof(linePart.c_str());
                    material->AddProperty(&Shininess, 1, AI_MATKEY_SHININESS_STRENGTH);
                }
                else if (linePart=="$shininess_exponent")
                {
                    ss >> linePart;
                    float Shininess = fast_atof(linePart.c_str());
                    material->AddProperty(&Shininess, 1, AI_MATKEY_SHININESS);
                }
                //Properties from Venetica:
                else if (linePart=="$diffuse_map")
                {
                    ss >> linePart;
                    if (linePart[0] == '"')// "file" -> file
                        linePart = linePart.substr(1, linePart.size()-2);
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_DIFFUSE, 0));
                }
                else if (linePart=="$specular_map")
                {
                    ss >> linePart;
                    if (linePart[0] == '"')// "file" -> file
                        linePart = linePart.substr(1, linePart.size()-2);
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_SHININESS, 0));
                }
                else if (linePart=="$normal_map")
                {
                    ss >> linePart;
                    if (linePart[0]=='"')// "file" -> file
                        linePart = linePart.substr(1, linePart.size()-2);
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_NORMALS, 0));
                }
                else if (linePart=="$light_map")
                {
                    ss >> linePart;
                    if (linePart[0]=='"') {
                        linePart = linePart.substr(1, linePart.size() - 2);
                    }
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_LIGHTMAP, 0));
                }
            }
        }
        ss >> linePart;
    }

    return material;
}